

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18e3f4::VmorpherState::deviceUpdate(VmorpherState *this,ALCdevice *param_1)

{
  _Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> __f;
  _Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> __f_00;
  offset_in_FormantFilter_to_subr in_RAX;
  long lVar1;
  undefined8 unaff_RBX;
  float *pfVar2;
  long lVar3;
  FormantFilter *__first;
  
  pfVar2 = this->mChans[0].CurrentGains;
  for (lVar3 = 0x20; lVar3 != 0x1020; lVar3 = lVar3 + 0x100) {
    __first = (FormantFilter *)((long)&this->mChans[0].Formants[0][2].mCoeff + lVar3);
    __f.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._8_8_ = unaff_RBX
    ;
    __f.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._M_pmf = in_RAX;
    std::
    for_each<(anonymous_namespace)::FormantFilter*,std::_Mem_fn<void((anonymous_namespace)::FormantFilter::*)()>>
              ((_Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> *)
               ((long)(this->mChans[0].Formants + -1) + 0x20 + lVar3),__first,
               (FormantFilter *)FormantFilter::clear,__f);
    __f_00.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._8_8_ =
         unaff_RBX;
    __f_00.super__Mem_fn_base<void_((anonymous_namespace)::FormantFilter::*)(),_true>._M_pmf =
         in_RAX;
    std::
    for_each<(anonymous_namespace)::FormantFilter*,std::_Mem_fn<void((anonymous_namespace)::FormantFilter::*)()>>
              ((_Mem_fn<void_((anonymous_namespace)::FormantFilter::*)()> *)__first,
               (FormantFilter *)((long)&this->mChans[0].Formants[1][2].mCoeff + lVar3),
               (FormantFilter *)FormantFilter::clear,__f_00);
    for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)pfVar2 + lVar1) = 0;
    }
    pfVar2 = pfVar2 + 0x40;
  }
  return;
}

Assistant:

void VmorpherState::deviceUpdate(const ALCdevice* /*device*/)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.Formants[VOWEL_A_INDEX]), std::end(e.Formants[VOWEL_A_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::for_each(std::begin(e.Formants[VOWEL_B_INDEX]), std::end(e.Formants[VOWEL_B_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}